

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O2

void enet_peer_disconnect(ENetPeer *peer,enet_uint32 data)

{
  ENetProtocol local_40;
  
  if ((ENET_PEER_STATE_ZOMBIE < peer->state) || ((0x381U >> (peer->state & 0x1f) & 1) == 0)) {
    enet_peer_reset_queues(peer);
    local_40.header.channelID = 0xff;
    local_40.disconnect.data =
         data >> 0x18 | (data & 0xff0000) >> 8 | (data & 0xff00) << 8 | data << 0x18;
    local_40.header.command = 'D';
    if (peer->state - ENET_PEER_STATE_CONNECTED < 2) {
      local_40.header.command = 0x84;
    }
    enet_peer_queue_outgoing_command(peer,&local_40,(ENetPacket *)0x0,0,0);
    if (1 < peer->state - ENET_PEER_STATE_CONNECTED) {
      enet_host_flush(peer->host);
      enet_peer_reset(peer);
      return;
    }
    enet_peer_on_disconnect(peer);
    peer->state = ENET_PEER_STATE_DISCONNECTING;
  }
  return;
}

Assistant:

void enet_peer_disconnect(ENetPeer *peer, enet_uint32 data) {
        ENetProtocol command;

        if (peer->state == ENET_PEER_STATE_DISCONNECTING ||
            peer->state == ENET_PEER_STATE_DISCONNECTED ||
            peer->state == ENET_PEER_STATE_ACKNOWLEDGING_DISCONNECT ||
            peer->state == ENET_PEER_STATE_ZOMBIE
        ) {
            return;
        }

        enet_peer_reset_queues(peer);

        command.header.command   = ENET_PROTOCOL_COMMAND_DISCONNECT;
        command.header.channelID = 0xFF;
        command.disconnect.data  = ENET_HOST_TO_NET_32(data);

        if (peer->state == ENET_PEER_STATE_CONNECTED || peer->state == ENET_PEER_STATE_DISCONNECT_LATER) {
            command.header.command |= ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
        } else {
            command.header.command |= ENET_PROTOCOL_COMMAND_FLAG_UNSEQUENCED;
        }

        enet_peer_queue_outgoing_command(peer, &command, NULL, 0, 0);

        if (peer->state == ENET_PEER_STATE_CONNECTED || peer->state == ENET_PEER_STATE_DISCONNECT_LATER) {
            enet_peer_on_disconnect(peer);

            peer->state = ENET_PEER_STATE_DISCONNECTING;
        } else {
            enet_host_flush(peer->host);
            enet_peer_reset(peer);
        }
    }